

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int_scan.cpp
# Opt level: O2

LOs __thiscall Omega_h::offset_scan<int>(Omega_h *this,Read<int> *a,string *name)

{
  Alloc *pAVar1;
  CastIterator<int,_int> first;
  ulong uVar2;
  void *extraout_RDX;
  size_t sVar3;
  LOs LVar4;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_a9;
  Write<int> out;
  Write<int> local_88;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_int_scan.cpp"
             ,&local_a9);
  std::operator+(&local_38,&local_58,":");
  std::__cxx11::to_string(&local_78,0xc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,&local_38
                 ,&local_78);
  begin_code("offset_scan",(char *)out.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  Write<int>::Write(&out,(int)(sVar3 >> 2) + 1,name);
  Write<int>::set(&out,0,0);
  pAVar1 = (a->write_).shared_alloc_.alloc;
  first.ptr = (int *)(a->write_).shared_alloc_.direct_ptr;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  inclusive_scan<Omega_h::CastIterator<int,int>,int*>
            (first,(CastIterator<int,_int>)(first.ptr + (int)(uVar2 >> 2)),
             (int *)((long)out.shared_alloc_.direct_ptr + 4));
  Write<int>::Write(&local_88,&out);
  Read<int>::Read((Read<signed_char> *)this,&local_88);
  Write<int>::~Write(&local_88);
  Write<int>::~Write(&out);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  LVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar4.write_.shared_alloc_;
}

Assistant:

LOs offset_scan(Read<T> a, std::string const& name) {
  OMEGA_H_TIME_FUNCTION;
  Write<LO> out(a.size() + 1, name);
  out.set(0, 0);
  auto const first = CastIterator<LO, T>(a.begin());
  auto const last = CastIterator<LO, T>(a.end());
  auto const result = out.begin() + 1;
  inclusive_scan(first, last, result);
  return out;
}